

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaccard.cpp
# Opt level: O2

void duckdb::JaccardFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  unsigned_long *puVar3;
  double *pdVar4;
  reference vector;
  reference vector_00;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  idx_t i;
  idx_t iVar9;
  ulong uVar10;
  long lVar11;
  data_ptr_t pdVar12;
  undefined8 in_R8;
  ValidityMask *in_R9;
  ulong uVar13;
  data_ptr_t pdVar14;
  idx_t count;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  idx_t i_1;
  data_ptr_t pdVar18;
  bool bVar19;
  double dVar20;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t left_07;
  string_t left_08;
  string_t left_09;
  string_t left_10;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  string_t right_07;
  string_t right_08;
  string_t right_09;
  string_t right_10;
  idx_t in_stack_ffffffffffffff08;
  data_ptr_t pdVar21;
  data_ptr_t pdVar22;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat ldata;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar4 = (double *)result->data;
    if (((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) &&
       ((puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar3 == (unsigned_long *)0x0 || ((*puVar3 & 1) != 0)))) {
      left.value.pointer.ptr = (char *)*(undefined8 *)vector_00->data;
      left.value._0_8_ = *(undefined8 *)(vector->data + 8);
      right.value.pointer.ptr = (char *)in_R8;
      right.value._0_8_ = *(undefined8 *)(vector_00->data + 8);
      dVar20 = BinaryLambdaWrapper::
               Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                         (*(Vector **)vector->data,left,right,in_R9,in_stack_ffffffffffffff08);
      *pdVar4 = dVar20;
      return;
    }
  }
  else {
    count = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      pdVar18 = vector->data;
      pdVar12 = vector_00->data;
      puVar3 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar22 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,&vector->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar18 = pdVar18 + 8;
          for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
            left_05.value.pointer.ptr = (char *)*(undefined8 *)pdVar12;
            left_05.value._0_8_ = *(undefined8 *)pdVar18;
            right_05.value.pointer.ptr = (char *)in_R8;
            right_05.value._0_8_ = *(undefined8 *)(pdVar12 + 8);
            dVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                               (*(Vector **)(pdVar18 + -8),left_05,right_05,in_R9,(idx_t)pdVar22);
            *(double *)(pdVar22 + iVar9 * 8) = dVar20;
            pdVar18 = pdVar18 + 0x10;
          }
          return;
        }
        uVar7 = 0;
        uVar13 = 0;
        do {
          if (uVar7 == count + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar10 = uVar13 + 0x40;
            if (count <= uVar13 + 0x40) {
              uVar10 = count;
            }
LAB_01d7676c:
            pdVar14 = pdVar18 + uVar13 * 0x10 + 8;
            for (; uVar6 = uVar13, pdVar21 = pdVar22, uVar13 < uVar10; uVar13 = uVar13 + 1) {
              left_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar12;
              left_00.value._0_8_ = *(undefined8 *)pdVar14;
              right_00.value.pointer.ptr = (char *)in_R8;
              right_00.value._0_8_ = *(undefined8 *)(pdVar12 + 8);
              dVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                 (*(Vector **)(pdVar14 + -8),left_00,right_00,in_R9,(idx_t)pdVar22);
              *(double *)(pdVar22 + uVar13 * 8) = dVar20;
              pdVar14 = pdVar14 + 0x10;
            }
          }
          else {
            uVar16 = puVar3[uVar7];
            uVar10 = uVar13 + 0x40;
            if (count <= uVar13 + 0x40) {
              uVar10 = count;
            }
            if (uVar16 == 0xffffffffffffffff) goto LAB_01d7676c;
            uVar6 = uVar10;
            pdVar21 = pdVar22;
            if (uVar16 != 0) {
              pdVar14 = pdVar18 + uVar13 * 0x10 + 8;
              for (uVar15 = 0; uVar6 = uVar13 + uVar15, uVar13 + uVar15 < uVar10;
                  uVar15 = uVar15 + 1) {
                if ((uVar16 >> (uVar15 & 0x3f) & 1) != 0) {
                  left_01.value.pointer.ptr = (char *)*(undefined8 *)pdVar12;
                  left_01.value._0_8_ = *(undefined8 *)pdVar14;
                  right_01.value.pointer.ptr = (char *)in_R8;
                  right_01.value._0_8_ = *(undefined8 *)(pdVar12 + 8);
                  dVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                     (*(Vector **)(pdVar14 + -8),left_01,right_01,in_R9,
                                      (idx_t)pdVar21);
                  *(double *)(pdVar22 + uVar15 * 8 + uVar13 * 8) = dVar20;
                }
                pdVar14 = pdVar14 + 0x10;
              }
            }
          }
          uVar7 = uVar7 + 1;
          uVar13 = uVar6;
          pdVar22 = pdVar21;
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar18 = vector->data;
          pdVar12 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar22 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,&vector->validity);
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            lVar11 = 0;
            while (bVar19 = count != 0, count = count - 1, bVar19) {
              left_10.value.pointer.ptr = (char *)*(undefined8 *)(pdVar12 + lVar11 * 2);
              left_10.value._0_8_ = *(undefined8 *)(pdVar18 + lVar11 * 2 + 8);
              right_10.value.pointer.ptr = (char *)in_R8;
              right_10.value._0_8_ = *(undefined8 *)(pdVar12 + lVar11 * 2 + 8);
              dVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                 (*(Vector **)(pdVar18 + lVar11 * 2),left_10,right_10,in_R9,
                                  (idx_t)pdVar22);
              *(double *)(pdVar22 + lVar11) = dVar20;
              lVar11 = lVar11 + 8;
            }
          }
          else {
            uVar13 = 0;
            for (uVar7 = 0; uVar7 != count + 0x3f >> 6; uVar7 = uVar7 + 1) {
              puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar3 == (unsigned_long *)0x0) {
                uVar10 = uVar13 + 0x40;
                if (count <= uVar13 + 0x40) {
                  uVar10 = count;
                }
LAB_01d76bc6:
                uVar16 = uVar13 << 4 | 8;
                for (; uVar6 = uVar13, pdVar14 = pdVar22, uVar13 < uVar10; uVar13 = uVar13 + 1) {
                  left_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar12 + (uVar16 - 8));
                  left_06.value._0_8_ = *(undefined8 *)(pdVar18 + uVar16);
                  right_06.value.pointer.ptr = (char *)in_R8;
                  right_06.value._0_8_ = *(undefined8 *)(pdVar12 + uVar16);
                  dVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                     (*(Vector **)(pdVar18 + (uVar16 - 8)),left_06,right_06,in_R9,
                                      (idx_t)pdVar22);
                  *(double *)(pdVar22 + uVar13 * 8) = dVar20;
                  uVar16 = uVar16 + 0x10;
                }
              }
              else {
                uVar16 = puVar3[uVar7];
                uVar10 = uVar13 + 0x40;
                if (count <= uVar13 + 0x40) {
                  uVar10 = count;
                }
                if (uVar16 == 0xffffffffffffffff) goto LAB_01d76bc6;
                uVar6 = uVar10;
                pdVar14 = pdVar22;
                if (uVar16 != 0) {
                  uVar17 = uVar13 << 4 | 8;
                  for (uVar15 = 0; uVar6 = uVar13 + uVar15, uVar13 + uVar15 < uVar10;
                      uVar15 = uVar15 + 1) {
                    if ((uVar16 >> (uVar15 & 0x3f) & 1) != 0) {
                      left_07.value.pointer.ptr = (char *)*(undefined8 *)(pdVar12 + (uVar17 - 8));
                      left_07.value._0_8_ = *(undefined8 *)(pdVar18 + uVar17);
                      right_07.value.pointer.ptr = (char *)in_R8;
                      right_07.value._0_8_ = *(undefined8 *)(pdVar12 + uVar17);
                      dVar20 = BinaryLambdaWrapper::
                               Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                         (*(Vector **)(pdVar18 + (uVar17 - 8)),left_07,right_07,
                                          in_R9,(idx_t)pdVar14);
                      *(double *)(pdVar22 + uVar15 * 8 + uVar13 * 8) = dVar20;
                    }
                    uVar17 = uVar17 + 0x10;
                  }
                }
              }
              uVar13 = uVar6;
              pdVar22 = pdVar14;
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,count,&ldata);
          Vector::ToUnifiedFormat(vector_00,count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar18 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
              iVar5 = iVar9;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar5 = (idx_t)(ldata.sel)->sel_vector[iVar9];
              }
              iVar8 = iVar9;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar8 = (idx_t)(local_c0.sel)->sel_vector[iVar9];
              }
              left_02.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar8 * 0x10);
              left_02.value._0_8_ = *(undefined8 *)(ldata.data + iVar5 * 0x10 + 8);
              right_02.value.pointer.ptr = (char *)in_R8;
              right_02.value._0_8_ = *(undefined8 *)(local_c0.data + iVar8 * 0x10 + 8);
              dVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                 (*(Vector **)(ldata.data + iVar5 * 0x10),left_02,right_02,in_R9,
                                  (idx_t)pdVar18);
              *(double *)(pdVar18 + iVar9 * 8) = dVar20;
            }
          }
          else {
            for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
              iVar5 = iVar9;
              if ((ldata.sel)->sel_vector != (sel_t *)0x0) {
                iVar5 = (idx_t)(ldata.sel)->sel_vector[iVar9];
              }
              iVar8 = iVar9;
              if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
                iVar8 = (idx_t)(local_c0.sel)->sel_vector[iVar9];
              }
              if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar8 >> 6] >> (iVar8 & 0x3f) & 1) != 0)))) {
                left_08.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar8 * 0x10);
                left_08.value._0_8_ = *(undefined8 *)(ldata.data + iVar5 * 0x10 + 8);
                right_08.value.pointer.ptr = (char *)in_R8;
                right_08.value._0_8_ = *(undefined8 *)(local_c0.data + iVar8 * 0x10 + 8);
                dVar20 = BinaryLambdaWrapper::
                         Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                   (*(Vector **)(ldata.data + iVar5 * 0x10),left_08,right_08,in_R9,
                                    (idx_t)pdVar18);
                *(double *)(pdVar18 + iVar9 * 8) = dVar20;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar9);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      pdVar18 = vector->data;
      puVar3 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar12 = vector_00->data;
      if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar22 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,&vector_00->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar12 = pdVar12 + 8;
          for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
            left_09.value.pointer.ptr = (char *)*(undefined8 *)(pdVar12 + -8);
            left_09.value._0_8_ = *(undefined8 *)(pdVar18 + 8);
            right_09.value.pointer.ptr = (char *)in_R8;
            right_09.value._0_8_ = *(undefined8 *)pdVar12;
            dVar20 = BinaryLambdaWrapper::
                     Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                               (*(Vector **)pdVar18,left_09,right_09,in_R9,(idx_t)pdVar22);
            *(double *)(pdVar22 + iVar9 * 8) = dVar20;
            pdVar12 = pdVar12 + 0x10;
          }
          return;
        }
        uVar7 = 0;
        uVar13 = 0;
        do {
          if (uVar7 == count + 0x3f >> 6) {
            return;
          }
          puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar10 = uVar13 + 0x40;
            if (count <= uVar13 + 0x40) {
              uVar10 = count;
            }
LAB_01d76a03:
            pdVar14 = pdVar12 + uVar13 * 0x10 + 8;
            for (; uVar6 = uVar13, pdVar21 = pdVar22, uVar13 < uVar10; uVar13 = uVar13 + 1) {
              left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar14 + -8);
              left_03.value._0_8_ = *(undefined8 *)(pdVar18 + 8);
              right_03.value.pointer.ptr = (char *)in_R8;
              right_03.value._0_8_ = *(undefined8 *)pdVar14;
              dVar20 = BinaryLambdaWrapper::
                       Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                 (*(Vector **)pdVar18,left_03,right_03,in_R9,(idx_t)pdVar22);
              *(double *)(pdVar22 + uVar13 * 8) = dVar20;
              pdVar14 = pdVar14 + 0x10;
            }
          }
          else {
            uVar16 = puVar3[uVar7];
            uVar10 = uVar13 + 0x40;
            if (count <= uVar13 + 0x40) {
              uVar10 = count;
            }
            if (uVar16 == 0xffffffffffffffff) goto LAB_01d76a03;
            uVar6 = uVar10;
            pdVar21 = pdVar22;
            if (uVar16 != 0) {
              pdVar14 = pdVar12 + uVar13 * 0x10 + 8;
              for (uVar15 = 0; uVar6 = uVar13 + uVar15, uVar13 + uVar15 < uVar10;
                  uVar15 = uVar15 + 1) {
                if ((uVar16 >> (uVar15 & 0x3f) & 1) != 0) {
                  left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar14 + -8);
                  left_04.value._0_8_ = *(undefined8 *)(pdVar18 + 8);
                  right_04.value.pointer.ptr = (char *)in_R8;
                  right_04.value._0_8_ = *(undefined8 *)pdVar14;
                  dVar20 = BinaryLambdaWrapper::
                           Operation<duckdb::JaccardFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,double>
                                     (*(Vector **)pdVar18,left_04,right_04,in_R9,(idx_t)pdVar21);
                  *(double *)(pdVar22 + uVar15 * 8 + uVar13 * 8) = dVar20;
                }
                pdVar14 = pdVar14 + 0x10;
              }
            }
          }
          uVar7 = uVar7 + 1;
          uVar13 = uVar6;
          pdVar22 = pdVar21;
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void JaccardFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &tgt_vec = args.data[1];

	BinaryExecutor::Execute<string_t, string_t, double>(
	    str_vec, tgt_vec, result, args.size(),
	    [&](string_t str, string_t tgt) { return JaccardScalarFunction(result, str, tgt); });
}